

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.hpp
# Opt level: O0

unique_ptr<double[],_std::default_delete<double[]>_> __thiscall
qclab::dense::init_unique_array<double>(dense *this,int64_t size,double value)

{
  pointer __first;
  pointer pdVar1;
  unique_ptr<double[],_std::default_delete<double[]>_> local_28;
  unique_ptr<double[],_std::default_delete<double[]>_> mem;
  double value_local;
  int64_t size_local;
  
  mem._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
  super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
  super__Head_base<0UL,_double_*,_false>._M_head_impl =
       (__uniq_ptr_data<double,_std::default_delete<double[]>,_true,_true>)
       (__uniq_ptr_data<double,_std::default_delete<double[]>,_true,_true>)value;
  alloc_unique_array<double>((dense *)&local_28,size);
  __first = std::unique_ptr<double[],_std::default_delete<double[]>_>::get(&local_28);
  pdVar1 = std::unique_ptr<double[],_std::default_delete<double[]>_>::get(&local_28);
  std::fill<double*,double>(__first,pdVar1 + size,(double *)&mem);
  std::unique_ptr<double[],_std::default_delete<double[]>_>::unique_ptr
            ((unique_ptr<double[],_std::default_delete<double[]>_> *)this,&local_28);
  std::unique_ptr<double[],_std::default_delete<double[]>_>::~unique_ptr(&local_28);
  return (__uniq_ptr_data<double,_std::default_delete<double[]>,_true,_true>)
         (__uniq_ptr_data<double,_std::default_delete<double[]>,_true,_true>)this;
}

Assistant:

inline auto init_unique_array( const int64_t size , const T value ) {
      auto mem = alloc_unique_array< T >( size ) ;
      std::fill( mem.get() , mem.get() + size , value ) ;
      return mem ;
    }